

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collector.h
# Opt level: O3

void __thiscall
jaegertracing::thrift::CollectorProcessor::CollectorProcessor
          (CollectorProcessor *this,shared_ptr<jaegertracing::thrift::CollectorIf> *iface)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  mapped_type *pmVar3;
  key_type local_40;
  
  (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
  super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
  super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__CollectorProcessor_00273050;
  (this->iface_).super___shared_ptr<jaegertracing::thrift::CollectorIf,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (iface->
           super___shared_ptr<jaegertracing::thrift::CollectorIf,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (iface->
           super___shared_ptr<jaegertracing::thrift::CollectorIf,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->iface_).super___shared_ptr<jaegertracing::thrift::CollectorIf,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  p_Var1 = &(this->processMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->processMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->processMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->processMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->processMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->processMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"submitBatches","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::CollectorProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
           ::operator[](&this->processMap_,&local_40);
  *pmVar3 = (mapped_type)process_submitBatches;
  pmVar3[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

CollectorProcessor(::std::shared_ptr<CollectorIf> iface) :
    iface_(iface) {
    processMap_["submitBatches"] = &CollectorProcessor::process_submitBatches;
  }